

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestCase * __thiscall testing::UnitTest::current_test_case(UnitTest *this)

{
  TestSuite *pTVar1;
  GTestMutexLock *in_RDI;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffffc8;
  
  internal::GTestMutexLock::GTestMutexLock(in_RDI,in_stack_ffffffffffffffc8);
  pTVar1 = internal::UnitTestImpl::current_test_suite((UnitTestImpl *)in_RDI[8].mutex_);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x588400);
  return pTVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_suite();
}